

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_empty.c
# Opt level: O0

void test_write_format_tar_empty(void)

{
  archive *paVar1;
  uint i;
  size_t used;
  char buff [2048];
  archive *a;
  void *in_stack_fffffffffffff7d8;
  void *pvVar2;
  undefined4 in_stack_fffffffffffff7e0;
  int in_stack_fffffffffffff7e4;
  wchar_t in_stack_fffffffffffff7e8;
  wchar_t in_stack_fffffffffffff7ec;
  wchar_t wVar3;
  undefined4 in_stack_fffffffffffff7f0;
  wchar_t in_stack_fffffffffffff7f4;
  archive *in_stack_fffffffffffff7f8;
  void *in_stack_fffffffffffff810;
  
  paVar1 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
  archive_write_set_format_ustar
            ((archive *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
  archive_write_add_filter_none(paVar1);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
  archive_write_set_bytes_per_block
            ((archive *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
             in_stack_fffffffffffff7e4);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
  archive_write_set_bytes_in_last_block
            ((archive *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
             in_stack_fffffffffffff7e4);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
  archive_write_open_memory
            (in_stack_fffffffffffff7f8,
             (void *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
             CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
             (size_t *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                   in_stack_fffffffffffff7d8);
  archive_write_close((archive *)0x2091ea);
  assertion_equal_int((char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                      CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                      (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                      (longlong)paVar1,(char *)0x20921c,in_stack_fffffffffffff810);
  archive_write_free((archive *)0x209229);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                      CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                      (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),0,
                      (char *)0x209257,in_stack_fffffffffffff810);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  for (wVar3 = L'\0';
      (ulong)(uint)wVar3 < CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0);
      wVar3 = wVar3 + L'\x01') {
    failure("Empty tar archive should be all nulls.");
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                     in_stack_fffffffffffff7e8,
                     (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  }
  paVar1 = archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                   in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  archive_write_set_format_pax((archive *)CONCAT44(wVar3,in_stack_fffffffffffff7e8));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                   in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  archive_write_add_filter_none(paVar1);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                   in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  archive_write_set_bytes_per_block
            ((archive *)CONCAT44(wVar3,in_stack_fffffffffffff7e8),in_stack_fffffffffffff7e4);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                   in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  archive_write_set_bytes_in_last_block
            ((archive *)CONCAT44(wVar3,in_stack_fffffffffffff7e8),in_stack_fffffffffffff7e4);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                   in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  archive_write_open_memory
            (in_stack_fffffffffffff7f8,
             (void *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
             CONCAT44(wVar3,in_stack_fffffffffffff7e8),
             (size_t *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                   in_stack_fffffffffffff7e8,
                   (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  archive_write_close((archive *)0x209467);
  assertion_equal_int((char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                      CONCAT44(wVar3,in_stack_fffffffffffff7e8),
                      (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                      (longlong)paVar1,(char *)0x209499,in_stack_fffffffffffff810);
  archive_write_free((archive *)0x2094a6);
  assertion_equal_int((char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                      CONCAT44(wVar3,in_stack_fffffffffffff7e8),
                      (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),0,
                      (char *)0x2094d4,in_stack_fffffffffffff810);
  pvVar2 = (void *)0x0;
  assertion_equal_int((char *)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                      CONCAT44(wVar3,in_stack_fffffffffffff7e8),
                      (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),0,
                      (char *)0x20950b,in_stack_fffffffffffff810);
  for (wVar3 = L'\0';
      (ulong)(uint)wVar3 < CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0);
      wVar3 = wVar3 + L'\x01') {
    failure("Empty tar archive should be all nulls.");
    assertion_assert((char *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),wVar3,
                     in_stack_fffffffffffff7e8,
                     (char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),pvVar2);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_empty)
{
	struct archive *a;
	char buff[2048];
	size_t used;
	unsigned int i;

	/* USTAR format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert(used == 1024);
	for (i = 0; i < used; i++) {
		failure("Empty tar archive should be all nulls.");
		assert(buff[i] == 0);
	}

	/* PAX format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assertEqualInt((int)used, 1024);
	for (i = 0; i < used; i++) {
		failure("Empty tar archive should be all nulls.");
		assert(buff[i] == 0);
	}
}